

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmfref.cpp
# Opt level: O2

int __thiscall
CVmObjFrameDesc::getp_get_invokee
          (CVmObjFrameDesc *this,vm_obj_id_t self,vm_val_t *retval,uint *argc)

{
  uint uVar1;
  long lVar2;
  anon_union_8_8_cb74652f_for_val aVar3;
  int iVar4;
  long *plVar5;
  undefined4 in_register_00000034;
  
  if (getp_get_invokee(unsigned_int,vm_val_t*,unsigned_int*)::desc == '\0') {
    iVar4 = __cxa_guard_acquire(&getp_get_invokee(unsigned_int,vm_val_t*,unsigned_int*)::desc,
                                CONCAT44(in_register_00000034,self));
    if (iVar4 != 0) {
      getp_get_invokee::desc.min_argc_ = 0;
      getp_get_invokee::desc.opt_argc_ = 0;
      getp_get_invokee::desc.varargs_ = 0;
      __cxa_guard_release(&getp_get_invokee(unsigned_int,vm_val_t*,unsigned_int*)::desc);
    }
  }
  iVar4 = CVmObject::get_prop_check_argc(retval,argc,&getp_get_invokee::desc);
  if (iVar4 == 0) {
    uVar1 = *(uint *)(this->super_CVmObject).ext_;
    plVar5 = *(long **)((long)&G_obj_table_X.pages_[uVar1 >> 0xc][uVar1 & 0xfff].ptr_ + 8);
    lVar2 = *plVar5;
    plVar5 = plVar5 + 9;
    if (lVar2 != 0) {
      plVar5 = (long *)(lVar2 + -0x70);
    }
    aVar3 = *(anon_union_8_8_cb74652f_for_val *)(plVar5 + 1);
    *(long *)retval = *plVar5;
    retval->val = aVar3;
  }
  return 1;
}

Assistant:

int CVmObjFrameDesc::getp_get_invokee(VMG_ vm_obj_id_t self, vm_val_t *retval,
                                      uint *argc)
{
    /* check arguments */
    static CVmNativeCodeDesc desc(0);
    if (get_prop_check_argc(retval, argc, &desc))
        return TRUE;

    /* get 'invokee' from the frame */
    get_frame_ref(vmg0_)->get_invokee(vmg_ retval);

    /* handled */
    return TRUE;
}